

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::tls13_client_handshake(SSL_HANDSHAKE *hs)

{
  int iVar1;
  ssl_hs_wait_t local_1c;
  client_hs_state_t state;
  ssl_hs_wait_t ret;
  SSL_HANDSHAKE *hs_local;
  
  do {
    if (hs->tls13_state == 0xe) {
      return ssl_hs_ok;
    }
    local_1c = ssl_hs_error;
    iVar1 = hs->tls13_state;
    switch(iVar1) {
    case 0:
      local_1c = do_read_hello_retry_request(hs);
      break;
    case 1:
      local_1c = do_send_second_client_hello(hs);
      break;
    case 2:
      local_1c = do_read_server_hello(hs);
      break;
    case 3:
      local_1c = do_read_encrypted_extensions(hs);
      break;
    case 4:
      local_1c = do_read_certificate_request(hs);
      break;
    case 5:
      local_1c = do_read_server_certificate(hs);
      break;
    case 6:
      local_1c = do_read_server_certificate_verify(hs);
      break;
    case 7:
      local_1c = do_server_certificate_reverify(hs);
      break;
    case 8:
      local_1c = do_read_server_finished(hs);
      break;
    case 9:
      local_1c = do_send_end_of_early_data(hs);
      break;
    case 10:
      local_1c = do_send_client_encrypted_extensions(hs);
      break;
    case 0xb:
      local_1c = do_send_client_certificate(hs);
      break;
    case 0xc:
      local_1c = do_send_client_certificate_verify(hs);
      break;
    case 0xd:
      local_1c = do_complete_second_flight(hs);
    }
    if (hs->tls13_state != iVar1) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
  } while (local_1c == ssl_hs_ok);
  return local_1c;
}

Assistant:

enum ssl_hs_wait_t tls13_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum client_hs_state_t state =
        static_cast<enum client_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state_read_hello_retry_request:
        ret = do_read_hello_retry_request(hs);
        break;
      case state_send_second_client_hello:
        ret = do_send_second_client_hello(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_read_encrypted_extensions:
        ret = do_read_encrypted_extensions(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_server_certificate_verify:
        ret = do_read_server_certificate_verify(hs);
        break;
      case state_server_certificate_reverify:
        ret = do_server_certificate_reverify(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_send_end_of_early_data:
        ret = do_send_end_of_early_data(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_encrypted_extensions:
        ret = do_send_client_encrypted_extensions(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_complete_second_flight:
        ret = do_complete_second_flight(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}